

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmnutils.cpp
# Opt level: O1

JSONElement * __thiscall JSONParser::parse(JSONElement *__return_storage_ptr__,JSONParser *this)

{
  int iVar1;
  char *pcVar2;
  pointer pcVar3;
  uint uVar4;
  jsmntok_t *pjVar5;
  
  jsmn_init(&this->m_parser);
  pcVar2 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = jsmn_parse(&this->m_parser,pcVar2,
                     (size_t)((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + ~(ulong)pcVar2),
                     (jsmntok_t *)0x0,0);
  if ((int)uVar4 < 0) {
    __return_storage_ptr__->m_tokens = (jsmntok_t *)0x0;
    __return_storage_ptr__->m_toksize = 0;
    __return_storage_ptr__->m_buffer = (char *)0x0;
  }
  else {
    if (this->m_tokens != (jsmntok_t *)0x0) {
      operator_delete__(this->m_tokens);
    }
    pjVar5 = (jsmntok_t *)operator_new__((ulong)uVar4 << 4);
    this->m_tokens = pjVar5;
    this->m_toksize = uVar4;
    jsmn_init(&this->m_parser);
    pcVar2 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    jsmn_parse(&this->m_parser,pcVar2,
               (size_t)((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish + ~(ulong)pcVar2),this->m_tokens,
               this->m_toksize);
    iVar1 = this->m_toksize;
    pcVar3 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __return_storage_ptr__->m_tokens = this->m_tokens;
    __return_storage_ptr__->m_toksize = (long)iVar1;
    __return_storage_ptr__->m_buffer = pcVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

JSONElement JSONParser::parse()
{
    // First run to count tokens
    jsmn_init(&m_parser);
    int toksize = jsmn_parse(&m_parser, &m_buffer[0],
            m_buffer.size() - 1, NULL, 0);
    if (toksize < 0) {
        return JSONElement(NULL, 0, NULL);
    }
    delete[] m_tokens;
    m_tokens = new jsmntok_t[toksize];
    m_toksize = toksize;
    // Parse tokens
    jsmn_init(&m_parser); // must re-initialize
    jsmn_parse(&m_parser, &m_buffer[0],
            m_buffer.size() - 1, m_tokens, m_toksize);
    return JSONElement(m_tokens, m_toksize, &m_buffer[0]);
}